

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall
LinearScan::RecordUse
          (LinearScan *this,Lifetime *lifetime,Instr *instr,RegOpnd *regOpnd,bool isFromBailout)

{
  bool bVar1;
  BOOLEAN BVar2;
  uint newUseValue;
  BOOL BVar3;
  byte local_31;
  uint32 useCountCost;
  bool isFromBailout_local;
  RegOpnd *regOpnd_local;
  Instr *instr_local;
  Lifetime *lifetime_local;
  LinearScan *this_local;
  
  local_31 = 1;
  if (this->currentOpHelperBlock == (OpHelperBlock *)0x0) {
    local_31 = isFromBailout;
  }
  regOpnd_local = (RegOpnd *)instr;
  instr_local = (Instr *)lifetime;
  lifetime_local = (Lifetime *)this;
  newUseValue = GetUseSpillCost(this->loopNest,(uint)(local_31 & 1));
  if (((regOpnd != (RegOpnd *)0x0) && (bVar1 = StackSym::IsConst(regOpnd->m_sym), bVar1)) ||
     ((((BVar3 = Func::HasTry(this->func), BVar3 != 0 &&
        (((bVar1 = Func::DoOptimizeTry(this->func), !bVar1 && (bVar1 = IsInLoop(this), bVar1)) &&
         ((LabelInstr *)instr_local->m_src1 != this->lastLabel)))) &&
       (BVar2 = BVSparse<Memory::JitArenaAllocator>::Test
                          (this->liveOnBackEdgeSyms,*(BVIndex *)(instr_local->_vptr_Instr + 2)),
       BVar2 != '\0')) &&
      ((*(uint32 *)&instr_local[1].globOptInstrString != this->currentBlockNumber ||
       (bVar1 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Empty
                          ((SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
                           &instr_local->m_prev), bVar1)))))) {
    SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Prepend
              ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)&instr_local->m_opcode,
               (Instr **)&regOpnd_local);
    instr_local->m_src1 = (Opnd *)this->lastLabel;
    Lifetime::AddToUseCountAdjust((Lifetime *)instr_local,newUseValue,this->curLoop,this->func);
  }
  else if (!isFromBailout) {
    Lifetime::SubFromUseCount((Lifetime *)instr_local,newUseValue,this->curLoop);
  }
  bVar1 = IsInLoop(this);
  if (bVar1) {
    RecordLoopUse(this,(Lifetime *)instr_local,(RegNum)instr_local[1].m_number);
  }
  return;
}

Assistant:

void
LinearScan::RecordUse(Lifetime * lifetime, IR::Instr * instr, IR::RegOpnd * regOpnd, bool isFromBailout)
{
    uint32 useCountCost = LinearScan::GetUseSpillCost(this->loopNest, (this->currentOpHelperBlock != nullptr || isFromBailout));

    // We only spill at the use for constants (i.e. reload) or for function with try blocks. We don't
    // have real accurate flow info for the later.
    if ((regOpnd && regOpnd->m_sym->IsConst())
          || (
                 (this->func->HasTry() && !this->func->DoOptimizeTry()) &&
                 this->IsInLoop() &&
                 lifetime->lastUseLabel != this->lastLabel &&
                 this->liveOnBackEdgeSyms->Test(lifetime->sym->m_id) &&
                 !(lifetime->previousDefBlockNumber == currentBlockNumber && !lifetime->defList.Empty())
             ))
    {
        // Keep track of all the uses of this lifetime in case we decide to spill it.
        // Note that we won't need to insert reloads if the use are not in a loop,
        // unless it is a const. We always reload const instead of spilling to the stack.
        //
        // We also don't need to insert reloads if the previous use was in the same basic block (the first use in the block
        // would have done the reload), or the previous def is in the same basic block and the value is still live. Furthermore,
        // if the previous def is in the same basic block, the value is still live, and there's another def after this use in
        // the same basic block, the previous def may not do a spill store, so we must not reload the value from the stack.
        lifetime->useList.Prepend(instr);
        lifetime->lastUseLabel = this->lastLabel;
        lifetime->AddToUseCountAdjust(useCountCost, this->curLoop, this->func);
    }
    else
    {
        if (!isFromBailout)
        {
            // Since we won't reload this use if the lifetime gets spilled, adjust the spill cost to reflect this.
            lifetime->SubFromUseCount(useCountCost, this->curLoop);
        }
    }
    if (this->IsInLoop())
    {
        this->RecordLoopUse(lifetime, lifetime->reg);
    }
}